

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  Geometry *pGVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  byte bVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined4 uVar25;
  undefined1 (*pauVar26) [16];
  int *piVar27;
  AABBNodeMB4D *node1;
  ulong uVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  RTCRayQueryContext *pRVar31;
  undefined1 (*pauVar32) [16];
  long lVar33;
  undefined1 (*pauVar34) [16];
  Scene *pSVar35;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  float fVar41;
  undefined1 auVar42 [16];
  float fVar50;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar49;
  undefined1 auVar46 [16];
  float fVar48;
  undefined1 auVar47 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar63;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar74;
  float fVar75;
  undefined1 auVar73 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar100;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar80;
  float fVar97;
  float fVar99;
  float fVar101;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar79;
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar96;
  float fVar98;
  undefined1 auVar95 [64];
  float fVar102;
  float fVar111;
  float fVar112;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar113;
  undefined1 auVar106 [16];
  float fVar114;
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  float fVar122;
  float fVar130;
  float fVar131;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar132;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [64];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [64];
  float fVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar148;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar146;
  float fVar147;
  undefined1 auVar145 [64];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [64];
  undefined1 auVar153 [16];
  undefined1 auVar154 [64];
  float fVar155;
  undefined1 auVar156 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar157 [64];
  float fVar161;
  undefined1 auVar162 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar163 [64];
  float fVar167;
  undefined1 auVar168 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar169 [64];
  float fVar173;
  undefined1 auVar174 [16];
  float fVar179;
  undefined1 auVar175 [16];
  float fVar177;
  float fVar178;
  undefined1 auVar176 [64];
  float fVar180;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar181 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2749;
  ulong local_2748;
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined4 local_2720;
  undefined4 uStack_271c;
  float fStack_2718;
  float fStack_2714;
  long local_2710;
  int local_2704;
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  RayQueryContext *local_26b8;
  undefined1 local_26b0 [16];
  RTCFilterFunctionNArguments local_26a0;
  long local_2670;
  ulong local_2668;
  undefined4 local_2660;
  uint local_265c;
  uint local_2658;
  uint local_2654;
  undefined4 local_2650;
  undefined4 local_264c;
  uint local_2648;
  uint local_2644;
  uint local_2640;
  undefined8 local_2630;
  undefined8 uStack_2628;
  undefined1 local_2620 [32];
  undefined1 local_2600 [16];
  undefined1 *local_25f0;
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [2] [16];
  undefined1 local_2560 [32];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar110 [64];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar26 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar91 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar63 = (ray->super_RayK<1>).tfar;
    auVar62 = ZEXT464((uint)fVar63);
    auVar64 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar63));
    auVar81._8_4_ = 0x7fffffff;
    auVar81._0_8_ = 0x7fffffff7fffffff;
    auVar81._12_4_ = 0x7fffffff;
    auVar81 = vandps_avx((undefined1  [16])aVar3,auVar81);
    auVar123._8_4_ = 0x219392ef;
    auVar123._0_8_ = 0x219392ef219392ef;
    auVar123._12_4_ = 0x219392ef;
    auVar81 = vcmpps_avx(auVar81,auVar123,1);
    auVar124._8_4_ = 0x3f800000;
    auVar124._0_8_ = 0x3f8000003f800000;
    auVar124._12_4_ = 0x3f800000;
    auVar123 = vdivps_avx(auVar124,(undefined1  [16])aVar3);
    auVar125._8_4_ = 0x5d5e0b6b;
    auVar125._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar125._12_4_ = 0x5d5e0b6b;
    auVar81 = vblendvps_avx(auVar123,auVar125,auVar81);
    auVar115._0_4_ = auVar81._0_4_ * 0.99999964;
    auVar115._4_4_ = auVar81._4_4_ * 0.99999964;
    auVar115._8_4_ = auVar81._8_4_ * 0.99999964;
    auVar115._12_4_ = auVar81._12_4_ * 0.99999964;
    auVar103._0_4_ = auVar81._0_4_ * 1.0000004;
    auVar103._4_4_ = auVar81._4_4_ * 1.0000004;
    auVar103._8_4_ = auVar81._8_4_ * 1.0000004;
    auVar103._12_4_ = auVar81._12_4_ * 1.0000004;
    auVar110 = ZEXT1664(auVar103);
    uVar25 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23c0._4_4_ = uVar25;
    local_23c0._0_4_ = uVar25;
    local_23c0._8_4_ = uVar25;
    local_23c0._12_4_ = uVar25;
    local_23c0._16_4_ = uVar25;
    local_23c0._20_4_ = uVar25;
    local_23c0._24_4_ = uVar25;
    local_23c0._28_4_ = uVar25;
    auVar145 = ZEXT3264(local_23c0);
    uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_23e0._4_4_ = uVar25;
    local_23e0._0_4_ = uVar25;
    local_23e0._8_4_ = uVar25;
    local_23e0._12_4_ = uVar25;
    local_23e0._16_4_ = uVar25;
    local_23e0._20_4_ = uVar25;
    local_23e0._24_4_ = uVar25;
    local_23e0._28_4_ = uVar25;
    auVar152 = ZEXT3264(local_23e0);
    uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2400._4_4_ = uVar25;
    local_2400._0_4_ = uVar25;
    local_2400._8_4_ = uVar25;
    local_2400._12_4_ = uVar25;
    local_2400._16_4_ = uVar25;
    local_2400._20_4_ = uVar25;
    local_2400._24_4_ = uVar25;
    local_2400._28_4_ = uVar25;
    auVar154 = ZEXT3264(local_2400);
    auVar81 = vshufps_avx(auVar115,auVar115,0);
    local_2420._16_16_ = auVar81;
    local_2420._0_16_ = auVar81;
    auVar157 = ZEXT3264(local_2420);
    auVar81 = vmovshdup_avx(auVar115);
    auVar123 = vshufps_avx(auVar115,auVar115,0x55);
    local_2440._16_16_ = auVar123;
    local_2440._0_16_ = auVar123;
    auVar163 = ZEXT3264(local_2440);
    auVar123 = vshufpd_avx(auVar115,auVar115,1);
    auVar124 = vshufps_avx(auVar115,auVar115,0xaa);
    local_2460._16_16_ = auVar124;
    local_2460._0_16_ = auVar124;
    auVar169 = ZEXT3264(local_2460);
    uVar29 = (ulong)(auVar115._0_4_ < 0.0) << 5;
    auVar124 = vshufps_avx(auVar103,auVar103,0);
    auVar121 = ZEXT1664(auVar124);
    local_2480._16_16_ = auVar124;
    local_2480._0_16_ = auVar124;
    auVar129 = ZEXT3264(local_2480);
    uVar38 = (ulong)(auVar81._0_4_ < 0.0) << 5 | 0x40;
    auVar81 = vshufps_avx(auVar103,auVar103,0x55);
    local_24a0._16_16_ = auVar81;
    local_24a0._0_16_ = auVar81;
    auVar138 = ZEXT3264(local_24a0);
    auVar81 = vshufps_avx(auVar103,auVar103,0xaa);
    auVar95 = ZEXT1664(auVar81);
    local_24c0._16_16_ = auVar81;
    local_24c0._0_16_ = auVar81;
    auVar176 = ZEXT3264(local_24c0);
    uVar39 = (ulong)(auVar123._0_4_ < 0.0) << 5 | 0x80;
    local_2668 = uVar29 ^ 0x20;
    auVar81 = vshufps_avx(auVar91,auVar91,0);
    local_2560._16_16_ = auVar81;
    local_2560._0_16_ = auVar81;
    auVar181 = ZEXT3264(local_2560);
    auVar81 = vshufps_avx(auVar64,auVar64,0);
    auVar47 = ZEXT3264(CONCAT1616(auVar81,auVar81));
    local_2630 = mm_lookupmask_ps._240_8_;
    uStack_2628 = mm_lookupmask_ps._248_8_;
    local_26b8 = context;
    local_2748 = uVar29;
LAB_014d0ae1:
    do {
      pauVar32 = pauVar26 + -1;
      pauVar26 = pauVar26 + -1;
      if (*(float *)(*pauVar32 + 8) <= auVar62._0_4_) {
        uVar40 = *(ulong *)*pauVar26;
        while ((uVar40 & 8) == 0) {
          uVar28 = uVar40 & 0xfffffffffffffff0;
          fVar63 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar73._4_4_ = fVar63;
          auVar73._0_4_ = fVar63;
          auVar73._8_4_ = fVar63;
          auVar73._12_4_ = fVar63;
          auVar73._16_4_ = fVar63;
          auVar73._20_4_ = fVar63;
          auVar73._24_4_ = fVar63;
          auVar73._28_4_ = fVar63;
          pfVar2 = (float *)(uVar28 + 0x100 + uVar29);
          pfVar1 = (float *)(uVar28 + 0x40 + uVar29);
          auVar61._0_4_ = fVar63 * *pfVar2 + *pfVar1;
          auVar61._4_4_ = fVar63 * pfVar2[1] + pfVar1[1];
          auVar61._8_4_ = fVar63 * pfVar2[2] + pfVar1[2];
          auVar61._12_4_ = fVar63 * pfVar2[3] + pfVar1[3];
          auVar61._16_4_ = fVar63 * pfVar2[4] + pfVar1[4];
          auVar61._20_4_ = fVar63 * pfVar2[5] + pfVar1[5];
          auVar61._24_4_ = fVar63 * pfVar2[6] + pfVar1[6];
          auVar61._28_4_ = auVar62._28_4_ + pfVar1[7];
          auVar61 = vsubps_avx(auVar61,auVar145._0_32_);
          auVar16._4_4_ = auVar157._4_4_ * auVar61._4_4_;
          auVar16._0_4_ = auVar157._0_4_ * auVar61._0_4_;
          auVar16._8_4_ = auVar157._8_4_ * auVar61._8_4_;
          auVar16._12_4_ = auVar157._12_4_ * auVar61._12_4_;
          auVar16._16_4_ = auVar157._16_4_ * auVar61._16_4_;
          auVar16._20_4_ = auVar157._20_4_ * auVar61._20_4_;
          auVar16._24_4_ = auVar157._24_4_ * auVar61._24_4_;
          auVar16._28_4_ = auVar61._28_4_;
          auVar61 = vmaxps_avx(auVar181._0_32_,auVar16);
          pfVar2 = (float *)(uVar28 + 0x100 + uVar38);
          pfVar1 = (float *)(uVar28 + 0x40 + uVar38);
          auVar93._0_4_ = fVar63 * *pfVar2 + *pfVar1;
          auVar93._4_4_ = fVar63 * pfVar2[1] + pfVar1[1];
          auVar93._8_4_ = fVar63 * pfVar2[2] + pfVar1[2];
          auVar93._12_4_ = fVar63 * pfVar2[3] + pfVar1[3];
          auVar93._16_4_ = fVar63 * pfVar2[4] + pfVar1[4];
          auVar93._20_4_ = fVar63 * pfVar2[5] + pfVar1[5];
          auVar93._24_4_ = fVar63 * pfVar2[6] + pfVar1[6];
          auVar93._28_4_ = auVar95._28_4_ + pfVar1[7];
          auVar16 = vsubps_avx(auVar93,auVar152._0_32_);
          auVar20._4_4_ = auVar163._4_4_ * auVar16._4_4_;
          auVar20._0_4_ = auVar163._0_4_ * auVar16._0_4_;
          auVar20._8_4_ = auVar163._8_4_ * auVar16._8_4_;
          auVar20._12_4_ = auVar163._12_4_ * auVar16._12_4_;
          auVar20._16_4_ = auVar163._16_4_ * auVar16._16_4_;
          auVar20._20_4_ = auVar163._20_4_ * auVar16._20_4_;
          auVar20._24_4_ = auVar163._24_4_ * auVar16._24_4_;
          auVar20._28_4_ = auVar16._28_4_;
          pfVar2 = (float *)(uVar28 + 0x100 + uVar39);
          pfVar1 = (float *)(uVar28 + 0x40 + uVar39);
          auVar108._0_4_ = fVar63 * *pfVar2 + *pfVar1;
          auVar108._4_4_ = fVar63 * pfVar2[1] + pfVar1[1];
          auVar108._8_4_ = fVar63 * pfVar2[2] + pfVar1[2];
          auVar108._12_4_ = fVar63 * pfVar2[3] + pfVar1[3];
          auVar108._16_4_ = fVar63 * pfVar2[4] + pfVar1[4];
          auVar108._20_4_ = fVar63 * pfVar2[5] + pfVar1[5];
          auVar108._24_4_ = fVar63 * pfVar2[6] + pfVar1[6];
          auVar108._28_4_ = auVar110._28_4_ + pfVar1[7];
          auVar17 = vsubps_avx(auVar108,auVar154._0_32_);
          auVar21._4_4_ = auVar169._4_4_ * auVar17._4_4_;
          auVar21._0_4_ = auVar169._0_4_ * auVar17._0_4_;
          auVar21._8_4_ = auVar169._8_4_ * auVar17._8_4_;
          auVar21._12_4_ = auVar169._12_4_ * auVar17._12_4_;
          auVar21._16_4_ = auVar169._16_4_ * auVar17._16_4_;
          auVar21._20_4_ = auVar169._20_4_ * auVar17._20_4_;
          auVar21._24_4_ = auVar169._24_4_ * auVar17._24_4_;
          auVar21._28_4_ = auVar17._28_4_;
          auVar16 = vmaxps_avx(auVar20,auVar21);
          local_2620 = vmaxps_avx(auVar61,auVar16);
          pfVar2 = (float *)(uVar28 + 0x100 + local_2668);
          pfVar1 = (float *)(uVar28 + 0x40 + local_2668);
          auVar94._0_4_ = fVar63 * *pfVar2 + *pfVar1;
          auVar94._4_4_ = fVar63 * pfVar2[1] + pfVar1[1];
          auVar94._8_4_ = fVar63 * pfVar2[2] + pfVar1[2];
          auVar94._12_4_ = fVar63 * pfVar2[3] + pfVar1[3];
          auVar94._16_4_ = fVar63 * pfVar2[4] + pfVar1[4];
          auVar94._20_4_ = fVar63 * pfVar2[5] + pfVar1[5];
          auVar94._24_4_ = fVar63 * pfVar2[6] + pfVar1[6];
          auVar94._28_4_ = auVar16._28_4_ + pfVar1[7];
          auVar61 = vsubps_avx(auVar94,auVar145._0_32_);
          auVar22._4_4_ = auVar129._4_4_ * auVar61._4_4_;
          auVar22._0_4_ = auVar129._0_4_ * auVar61._0_4_;
          auVar22._8_4_ = auVar129._8_4_ * auVar61._8_4_;
          auVar22._12_4_ = auVar129._12_4_ * auVar61._12_4_;
          auVar22._16_4_ = auVar129._16_4_ * auVar61._16_4_;
          auVar22._20_4_ = auVar129._20_4_ * auVar61._20_4_;
          auVar22._24_4_ = auVar129._24_4_ * auVar61._24_4_;
          auVar22._28_4_ = auVar61._28_4_;
          pfVar2 = (float *)(uVar28 + 0x100 + (uVar38 ^ 0x20));
          pfVar1 = (float *)(uVar28 + 0x40 + (uVar38 ^ 0x20));
          auVar109._0_4_ = fVar63 * *pfVar2 + *pfVar1;
          auVar109._4_4_ = fVar63 * pfVar2[1] + pfVar1[1];
          auVar109._8_4_ = fVar63 * pfVar2[2] + pfVar1[2];
          auVar109._12_4_ = fVar63 * pfVar2[3] + pfVar1[3];
          auVar109._16_4_ = fVar63 * pfVar2[4] + pfVar1[4];
          auVar109._20_4_ = fVar63 * pfVar2[5] + pfVar1[5];
          auVar109._24_4_ = fVar63 * pfVar2[6] + pfVar1[6];
          auVar109._28_4_ = auVar17._28_4_ + pfVar1[7];
          auVar61 = vsubps_avx(auVar109,auVar152._0_32_);
          auVar17._4_4_ = auVar138._4_4_ * auVar61._4_4_;
          auVar17._0_4_ = auVar138._0_4_ * auVar61._0_4_;
          auVar17._8_4_ = auVar138._8_4_ * auVar61._8_4_;
          auVar17._12_4_ = auVar138._12_4_ * auVar61._12_4_;
          auVar17._16_4_ = auVar138._16_4_ * auVar61._16_4_;
          auVar17._20_4_ = auVar138._20_4_ * auVar61._20_4_;
          auVar17._24_4_ = auVar138._24_4_ * auVar61._24_4_;
          auVar17._28_4_ = auVar61._28_4_;
          pfVar2 = (float *)(uVar28 + 0x100 + (uVar39 ^ 0x20));
          pfVar1 = (float *)(uVar28 + 0x40 + (uVar39 ^ 0x20));
          auVar120._0_4_ = fVar63 * *pfVar2 + *pfVar1;
          auVar120._4_4_ = fVar63 * pfVar2[1] + pfVar1[1];
          auVar120._8_4_ = fVar63 * pfVar2[2] + pfVar1[2];
          auVar120._12_4_ = fVar63 * pfVar2[3] + pfVar1[3];
          auVar120._16_4_ = fVar63 * pfVar2[4] + pfVar1[4];
          auVar120._20_4_ = fVar63 * pfVar2[5] + pfVar1[5];
          auVar120._24_4_ = fVar63 * pfVar2[6] + pfVar1[6];
          auVar120._28_4_ = auVar121._28_4_ + pfVar1[7];
          auVar61 = vsubps_avx(auVar120,auVar154._0_32_);
          auVar23._4_4_ = auVar176._4_4_ * auVar61._4_4_;
          auVar23._0_4_ = auVar176._0_4_ * auVar61._0_4_;
          auVar23._8_4_ = auVar176._8_4_ * auVar61._8_4_;
          auVar23._12_4_ = auVar176._12_4_ * auVar61._12_4_;
          auVar23._16_4_ = auVar176._16_4_ * auVar61._16_4_;
          auVar23._20_4_ = auVar176._20_4_ * auVar61._20_4_;
          auVar23._24_4_ = auVar176._24_4_ * auVar61._24_4_;
          auVar23._28_4_ = auVar61._28_4_;
          auVar121 = ZEXT3264(auVar23);
          auVar16 = vminps_avx(auVar17,auVar23);
          auVar61 = vminps_avx(auVar47._0_32_,auVar22);
          auVar61 = vminps_avx(auVar61,auVar16);
          auVar61 = vcmpps_avx(local_2620,auVar61,2);
          if (((uint)uVar40 & 7) == 6) {
            auVar16 = vcmpps_avx(*(undefined1 (*) [32])(uVar28 + 0x1c0),auVar73,2);
            auVar17 = vcmpps_avx(auVar73,*(undefined1 (*) [32])(uVar28 + 0x1e0),1);
            auVar17 = vandps_avx(auVar16,auVar17);
            auVar61 = vandps_avx(auVar17,auVar61);
            auVar81 = vpackssdw_avx(auVar61._0_16_,auVar61._16_16_);
          }
          else {
            auVar81 = vpackssdw_avx(auVar61._0_16_,auVar61._16_16_);
          }
          auVar110 = ZEXT3264(auVar16);
          auVar81 = vpsllw_avx(auVar81,0xf);
          auVar95 = ZEXT1664(auVar81);
          if ((((((((auVar81 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar81 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar81 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar81 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar81 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar81 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar81 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar81[0xf]) {
            auVar81 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar62 = ZEXT1664(auVar81);
            if (pauVar26 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_014d0ae1;
          }
          auVar81 = vpacksswb_avx(auVar81,auVar81);
          auVar62 = ZEXT1664(auVar81);
          bVar19 = SUB161(auVar81 >> 7,0) & 1 | (SUB161(auVar81 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar81 >> 0x17,0) & 1) << 2 | (SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar81 >> 0x27,0) & 1) << 4 | (SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar81 >> 0x37,0) & 1) << 6 | SUB161(auVar81 >> 0x3f,0) << 7;
          lVar37 = 0;
          if (bVar19 != 0) {
            for (; (bVar19 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
            }
          }
          uVar40 = *(ulong *)(uVar28 + lVar37 * 8);
          uVar36 = bVar19 - 1 & (uint)bVar19;
          if (uVar36 != 0) {
            uVar5 = *(uint *)(local_2620 + lVar37 * 4);
            lVar37 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
              }
            }
            uVar6 = *(ulong *)(uVar28 + lVar37 * 8);
            uVar4 = *(uint *)(local_2620 + lVar37 * 4);
            uVar36 = uVar36 - 1 & uVar36;
            if (uVar36 == 0) {
              if (uVar5 < uVar4) {
                *(ulong *)*pauVar26 = uVar6;
                *(uint *)(*pauVar26 + 8) = uVar4;
                pauVar26 = pauVar26 + 1;
              }
              else {
                *(ulong *)*pauVar26 = uVar40;
                *(uint *)(*pauVar26 + 8) = uVar5;
                pauVar26 = pauVar26 + 1;
                uVar40 = uVar6;
              }
            }
            else {
              auVar91._8_8_ = 0;
              auVar91._0_8_ = uVar40;
              auVar81 = vpunpcklqdq_avx(auVar91,ZEXT416(uVar5));
              auVar64._8_8_ = 0;
              auVar64._0_8_ = uVar6;
              auVar123 = vpunpcklqdq_avx(auVar64,ZEXT416(uVar4));
              lVar37 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                }
              }
              auVar82._8_8_ = 0;
              auVar82._0_8_ = *(ulong *)(uVar28 + lVar37 * 8);
              auVar91 = vpunpcklqdq_avx(auVar82,ZEXT416(*(uint *)(local_2620 + lVar37 * 4)));
              auVar95 = ZEXT1664(auVar91);
              uVar36 = uVar36 - 1 & uVar36;
              if (uVar36 == 0) {
                auVar64 = vpcmpgtd_avx(auVar123,auVar81);
                auVar124 = vpshufd_avx(auVar64,0xaa);
                auVar64 = vblendvps_avx(auVar123,auVar81,auVar124);
                auVar81 = vblendvps_avx(auVar81,auVar123,auVar124);
                auVar123 = vpcmpgtd_avx(auVar91,auVar64);
                auVar124 = vpshufd_avx(auVar123,0xaa);
                auVar123 = vblendvps_avx(auVar91,auVar64,auVar124);
                auVar110 = ZEXT1664(auVar123);
                auVar91 = vblendvps_avx(auVar64,auVar91,auVar124);
                auVar64 = vpcmpgtd_avx(auVar91,auVar81);
                auVar124 = vpshufd_avx(auVar64,0xaa);
                auVar95 = ZEXT1664(auVar124);
                auVar64 = vblendvps_avx(auVar91,auVar81,auVar124);
                auVar121 = ZEXT1664(auVar64);
                auVar81 = vblendvps_avx(auVar81,auVar91,auVar124);
                auVar62 = ZEXT1664(auVar81);
                *pauVar26 = auVar81;
                pauVar26[1] = auVar64;
                pauVar26 = pauVar26 + 2;
                uVar40 = auVar123._0_8_;
              }
              else {
                lVar37 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                  }
                }
                auVar121 = ZEXT464(*(uint *)(local_2620 + lVar37 * 4));
                auVar104._8_8_ = 0;
                auVar104._0_8_ = *(ulong *)(uVar28 + lVar37 * 8);
                auVar64 = vpunpcklqdq_avx(auVar104,ZEXT416(*(uint *)(local_2620 + lVar37 * 4)));
                auVar110 = ZEXT1664(auVar64);
                uVar36 = uVar36 - 1 & uVar36;
                uVar29 = (ulong)uVar36;
                if (uVar36 == 0) {
                  auVar124 = vpcmpgtd_avx(auVar123,auVar81);
                  auVar103 = vpshufd_avx(auVar124,0xaa);
                  auVar124 = vblendvps_avx(auVar123,auVar81,auVar103);
                  auVar81 = vblendvps_avx(auVar81,auVar123,auVar103);
                  auVar123 = vpcmpgtd_avx(auVar64,auVar91);
                  auVar103 = vpshufd_avx(auVar123,0xaa);
                  auVar123 = vblendvps_avx(auVar64,auVar91,auVar103);
                  auVar91 = vblendvps_avx(auVar91,auVar64,auVar103);
                  auVar64 = vpcmpgtd_avx(auVar91,auVar81);
                  auVar103 = vpshufd_avx(auVar64,0xaa);
                  auVar64 = vblendvps_avx(auVar91,auVar81,auVar103);
                  auVar110 = ZEXT1664(auVar64);
                  auVar81 = vblendvps_avx(auVar81,auVar91,auVar103);
                  auVar62 = ZEXT1664(auVar81);
                  auVar91 = vpcmpgtd_avx(auVar123,auVar124);
                  auVar103 = vpshufd_avx(auVar91,0xaa);
                  auVar91 = vblendvps_avx(auVar123,auVar124,auVar103);
                  auVar95 = ZEXT1664(auVar91);
                  auVar123 = vblendvps_avx(auVar124,auVar123,auVar103);
                  auVar124 = vpcmpgtd_avx(auVar64,auVar123);
                  auVar103 = vpshufd_avx(auVar124,0xaa);
                  auVar121 = ZEXT1664(auVar103);
                  auVar124 = vblendvps_avx(auVar64,auVar123,auVar103);
                  auVar123 = vblendvps_avx(auVar123,auVar64,auVar103);
                  *pauVar26 = auVar81;
                  pauVar26[1] = auVar123;
                  pauVar26[2] = auVar124;
                  uVar40 = auVar91._0_8_;
                  pauVar32 = pauVar26 + 3;
                }
                else {
                  *pauVar26 = auVar81;
                  pauVar26[1] = auVar123;
                  pauVar26[2] = auVar91;
                  pauVar26[3] = auVar64;
                  lVar37 = 0x30;
                  do {
                    lVar33 = lVar37;
                    lVar37 = 0;
                    if (uVar29 != 0) {
                      for (; (uVar29 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                      }
                    }
                    uVar40 = *(ulong *)(uVar28 + lVar37 * 8);
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ = uVar40;
                    auVar81 = vpunpcklqdq_avx(auVar51,ZEXT416(*(uint *)(local_2620 + lVar37 * 4)));
                    auVar62 = ZEXT1664(auVar81);
                    *(undefined1 (*) [16])(pauVar26[1] + lVar33) = auVar81;
                    uVar29 = uVar29 & uVar29 - 1;
                    lVar37 = lVar33 + 0x10;
                  } while (uVar29 != 0);
                  pauVar32 = (undefined1 (*) [16])(pauVar26[1] + lVar33);
                  if (lVar33 + 0x10 != 0) {
                    lVar37 = 0x10;
                    pauVar30 = pauVar26;
                    do {
                      auVar81 = pauVar30[1];
                      auVar62 = ZEXT1664(auVar81);
                      pauVar30 = pauVar30 + 1;
                      uVar36 = vextractps_avx(auVar81,2);
                      lVar33 = lVar37;
                      do {
                        if (uVar36 <= *(uint *)(pauVar26[-1] + lVar33 + 8)) {
                          pauVar34 = (undefined1 (*) [16])(*pauVar26 + lVar33);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar26 + lVar33) =
                             *(undefined1 (*) [16])(pauVar26[-1] + lVar33);
                        lVar33 = lVar33 + -0x10;
                        pauVar34 = pauVar26;
                      } while (lVar33 != 0);
                      *pauVar34 = auVar81;
                      lVar37 = lVar37 + 0x10;
                    } while (pauVar32 != pauVar30);
                    uVar40 = *(ulong *)*pauVar32;
                  }
                }
                auVar129 = ZEXT3264(auVar129._0_32_);
                auVar138 = ZEXT3264(auVar138._0_32_);
                auVar176 = ZEXT3264(auVar176._0_32_);
                auVar181 = ZEXT3264(local_2560);
                pauVar26 = pauVar32;
                uVar29 = local_2748;
              }
            }
          }
        }
        local_2670 = (ulong)((uint)uVar40 & 0xf) - 8;
        if (local_2670 != 0) {
          uVar40 = uVar40 & 0xfffffffffffffff0;
          local_2710 = 0;
          do {
            lVar37 = local_2710 * 0x140;
            fVar63 = (ray->super_RayK<1>).dir.field_0.m128[3];
            pfVar2 = (float *)(uVar40 + 0x90 + lVar37);
            pfVar1 = (float *)(uVar40 + lVar37);
            auVar52._0_4_ = fVar63 * *pfVar2 + *pfVar1;
            auVar52._4_4_ = fVar63 * pfVar2[1] + pfVar1[1];
            auVar52._8_4_ = fVar63 * pfVar2[2] + pfVar1[2];
            auVar52._12_4_ = fVar63 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xa0 + lVar37);
            pfVar1 = (float *)(uVar40 + 0x10 + lVar37);
            auVar65._0_4_ = fVar63 * *pfVar2 + *pfVar1;
            auVar65._4_4_ = fVar63 * pfVar2[1] + pfVar1[1];
            auVar65._8_4_ = fVar63 * pfVar2[2] + pfVar1[2];
            auVar65._12_4_ = fVar63 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xb0 + lVar37);
            pfVar1 = (float *)(uVar40 + 0x20 + lVar37);
            auVar156._0_4_ = fVar63 * *pfVar2 + *pfVar1;
            auVar156._4_4_ = fVar63 * pfVar2[1] + pfVar1[1];
            auVar156._8_4_ = fVar63 * pfVar2[2] + pfVar1[2];
            auVar156._12_4_ = fVar63 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xc0 + lVar37);
            pfVar1 = (float *)(uVar40 + 0x30 + lVar37);
            auVar105._0_4_ = fVar63 * *pfVar2 + *pfVar1;
            auVar105._4_4_ = fVar63 * pfVar2[1] + pfVar1[1];
            auVar105._8_4_ = fVar63 * pfVar2[2] + pfVar1[2];
            auVar105._12_4_ = fVar63 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xd0 + lVar37);
            pfVar1 = (float *)(uVar40 + 0x40 + lVar37);
            auVar116._0_4_ = fVar63 * *pfVar2 + *pfVar1;
            auVar116._4_4_ = fVar63 * pfVar2[1] + pfVar1[1];
            auVar116._8_4_ = fVar63 * pfVar2[2] + pfVar1[2];
            auVar116._12_4_ = fVar63 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xe0 + lVar37);
            pfVar1 = (float *)(uVar40 + 0x50 + lVar37);
            auVar162._0_4_ = fVar63 * *pfVar2 + *pfVar1;
            auVar162._4_4_ = fVar63 * pfVar2[1] + pfVar1[1];
            auVar162._8_4_ = fVar63 * pfVar2[2] + pfVar1[2];
            auVar162._12_4_ = fVar63 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xf0 + lVar37);
            pfVar1 = (float *)(uVar40 + 0x60 + lVar37);
            auVar140._0_4_ = fVar63 * *pfVar2 + *pfVar1;
            auVar140._4_4_ = fVar63 * pfVar2[1] + pfVar1[1];
            auVar140._8_4_ = fVar63 * pfVar2[2] + pfVar1[2];
            auVar140._12_4_ = fVar63 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0x100 + lVar37);
            pfVar1 = (float *)(uVar40 + 0x70 + lVar37);
            auVar149._0_4_ = fVar63 * *pfVar2 + *pfVar1;
            auVar149._4_4_ = fVar63 * pfVar2[1] + pfVar1[1];
            auVar149._8_4_ = fVar63 * pfVar2[2] + pfVar1[2];
            auVar149._12_4_ = fVar63 * pfVar2[3] + pfVar1[3];
            pfVar1 = (float *)(uVar40 + 0x110 + lVar37);
            pfVar2 = (float *)(uVar40 + 0x80 + lVar37);
            auVar42._0_4_ = fVar63 * *pfVar1 + *pfVar2;
            auVar42._4_4_ = fVar63 * pfVar1[1] + pfVar2[1];
            auVar42._8_4_ = fVar63 * pfVar1[2] + pfVar2[2];
            auVar42._12_4_ = fVar63 * pfVar1[3] + pfVar2[3];
            uVar25 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar153._4_4_ = uVar25;
            auVar153._0_4_ = uVar25;
            auVar153._8_4_ = uVar25;
            auVar153._12_4_ = uVar25;
            uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar168._4_4_ = uVar25;
            auVar168._0_4_ = uVar25;
            auVar168._8_4_ = uVar25;
            auVar168._12_4_ = uVar25;
            uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar174._4_4_ = uVar25;
            auVar174._0_4_ = uVar25;
            auVar174._8_4_ = uVar25;
            auVar174._12_4_ = uVar25;
            local_26e0 = vsubps_avx(auVar52,auVar153);
            local_26f0 = vsubps_avx(auVar65,auVar168);
            local_26b0 = vsubps_avx(auVar156,auVar174);
            auVar81 = vsubps_avx(auVar105,auVar153);
            auVar123 = vsubps_avx(auVar116,auVar168);
            auVar91 = vsubps_avx(auVar162,auVar174);
            auVar64 = vsubps_avx(auVar140,auVar153);
            auVar124 = vsubps_avx(auVar149,auVar168);
            auVar103 = vsubps_avx(auVar42,auVar174);
            local_2700 = vsubps_avx(auVar64,local_26e0);
            local_24d0 = vsubps_avx(auVar124,local_26f0);
            local_24e0 = vsubps_avx(auVar103,local_26b0);
            fVar8 = local_26f0._0_4_;
            fVar63 = auVar124._0_4_ + fVar8;
            fVar97 = local_26f0._4_4_;
            fVar74 = auVar124._4_4_ + fVar97;
            fVar10 = local_26f0._8_4_;
            fVar75 = auVar124._8_4_ + fVar10;
            fVar13 = local_26f0._12_4_;
            fVar76 = auVar124._12_4_ + fVar13;
            fVar9 = local_26b0._0_4_;
            fVar102 = auVar103._0_4_ + fVar9;
            fVar99 = local_26b0._4_4_;
            fVar111 = auVar103._4_4_ + fVar99;
            fVar11 = local_26b0._8_4_;
            fVar112 = auVar103._8_4_ + fVar11;
            fVar14 = local_26b0._12_4_;
            fVar113 = auVar103._12_4_ + fVar14;
            fVar41 = local_24e0._0_4_;
            auVar141._0_4_ = fVar41 * fVar63;
            fVar49 = local_24e0._4_4_;
            auVar141._4_4_ = fVar49 * fVar74;
            fVar48 = local_24e0._8_4_;
            auVar141._8_4_ = fVar48 * fVar75;
            fVar50 = local_24e0._12_4_;
            auVar141._12_4_ = fVar50 * fVar76;
            fVar180 = local_24d0._0_4_;
            auVar150._0_4_ = fVar180 * fVar102;
            fVar182 = local_24d0._4_4_;
            auVar150._4_4_ = fVar182 * fVar111;
            fVar183 = local_24d0._8_4_;
            auVar150._8_4_ = fVar183 * fVar112;
            fVar184 = local_24d0._12_4_;
            auVar150._12_4_ = fVar184 * fVar113;
            auVar115 = vsubps_avx(auVar150,auVar141);
            fVar80 = local_26e0._0_4_;
            fVar139 = auVar64._0_4_ + fVar80;
            fVar101 = local_26e0._4_4_;
            fVar146 = auVar64._4_4_ + fVar101;
            fVar12 = local_26e0._8_4_;
            fVar147 = auVar64._8_4_ + fVar12;
            fVar15 = local_26e0._12_4_;
            fVar148 = auVar64._12_4_ + fVar15;
            fVar173 = local_2700._0_4_;
            auVar106._0_4_ = fVar173 * fVar102;
            fVar177 = local_2700._4_4_;
            auVar106._4_4_ = fVar177 * fVar111;
            fVar178 = local_2700._8_4_;
            auVar106._8_4_ = fVar178 * fVar112;
            fVar179 = local_2700._12_4_;
            auVar106._12_4_ = fVar179 * fVar113;
            auVar151._0_4_ = fVar139 * fVar41;
            auVar151._4_4_ = fVar146 * fVar49;
            auVar151._8_4_ = fVar147 * fVar48;
            auVar151._12_4_ = fVar148 * fVar50;
            auVar125 = vsubps_avx(auVar151,auVar106);
            auVar142._0_4_ = fVar180 * fVar139;
            auVar142._4_4_ = fVar182 * fVar146;
            auVar142._8_4_ = fVar183 * fVar147;
            auVar142._12_4_ = fVar184 * fVar148;
            auVar43._0_4_ = fVar173 * fVar63;
            auVar43._4_4_ = fVar177 * fVar74;
            auVar43._8_4_ = fVar178 * fVar75;
            auVar43._12_4_ = fVar179 * fVar76;
            auVar82 = vsubps_avx(auVar43,auVar142);
            fVar63 = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_2740._4_4_ = fVar63;
            local_2740._0_4_ = fVar63;
            local_2740._8_4_ = fVar63;
            local_2740._12_4_ = fVar63;
            fVar74 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fStack_2718 = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_2500._0_4_ =
                 auVar115._0_4_ * fStack_2718 + fVar74 * auVar125._0_4_ + fVar63 * auVar82._0_4_;
            local_2500._4_4_ =
                 auVar115._4_4_ * fStack_2718 + fVar74 * auVar125._4_4_ + fVar63 * auVar82._4_4_;
            local_2500._8_4_ =
                 auVar115._8_4_ * fStack_2718 + fVar74 * auVar125._8_4_ + fVar63 * auVar82._8_4_;
            local_2500._12_4_ =
                 auVar115._12_4_ * fStack_2718 + fVar74 * auVar125._12_4_ + fVar63 * auVar82._12_4_;
            local_24f0 = vsubps_avx(local_26f0,auVar123);
            auVar115 = vsubps_avx(local_26b0,auVar91);
            fVar75 = fVar8 + auVar123._0_4_;
            fVar76 = fVar97 + auVar123._4_4_;
            fVar102 = fVar10 + auVar123._8_4_;
            fVar111 = fVar13 + auVar123._12_4_;
            fVar112 = auVar91._0_4_ + fVar9;
            fVar139 = auVar91._4_4_ + fVar99;
            fVar147 = auVar91._8_4_ + fVar11;
            fVar114 = auVar91._12_4_ + fVar14;
            fVar167 = auVar115._0_4_;
            auVar175._0_4_ = fVar167 * fVar75;
            fVar170 = auVar115._4_4_;
            auVar175._4_4_ = fVar170 * fVar76;
            fVar171 = auVar115._8_4_;
            auVar175._8_4_ = fVar171 * fVar102;
            fVar172 = auVar115._12_4_;
            auVar175._12_4_ = fVar172 * fVar111;
            fVar113 = local_24f0._0_4_;
            auVar83._0_4_ = fVar113 * fVar112;
            fVar146 = local_24f0._4_4_;
            auVar83._4_4_ = fVar146 * fVar139;
            fVar148 = local_24f0._8_4_;
            auVar83._8_4_ = fVar148 * fVar147;
            fVar77 = local_24f0._12_4_;
            auVar83._12_4_ = fVar77 * fVar114;
            auVar115 = vsubps_avx(auVar83,auVar175);
            auVar125 = vsubps_avx(local_26e0,auVar81);
            fVar155 = auVar125._0_4_;
            auVar107._0_4_ = fVar155 * fVar112;
            fVar158 = auVar125._4_4_;
            auVar107._4_4_ = fVar158 * fVar139;
            fVar159 = auVar125._8_4_;
            auVar107._8_4_ = fVar159 * fVar147;
            fVar160 = auVar125._12_4_;
            auVar107._12_4_ = fVar160 * fVar114;
            fVar112 = auVar81._0_4_ + fVar80;
            fVar139 = auVar81._4_4_ + fVar101;
            fVar147 = auVar81._8_4_ + fVar12;
            fVar114 = auVar81._12_4_ + fVar15;
            auVar143._0_4_ = fVar167 * fVar112;
            auVar143._4_4_ = fVar170 * fVar139;
            auVar143._8_4_ = fVar171 * fVar147;
            auVar143._12_4_ = fVar172 * fVar114;
            auVar125 = vsubps_avx(auVar143,auVar107);
            auVar133._0_4_ = fVar113 * fVar112;
            auVar133._4_4_ = fVar146 * fVar139;
            auVar133._8_4_ = fVar148 * fVar147;
            auVar133._12_4_ = fVar77 * fVar114;
            auVar44._0_4_ = fVar155 * fVar75;
            auVar44._4_4_ = fVar158 * fVar76;
            auVar44._8_4_ = fVar159 * fVar102;
            auVar44._12_4_ = fVar160 * fVar111;
            auVar82 = vsubps_avx(auVar44,auVar133);
            auVar110 = ZEXT1664(CONCAT412(fStack_2718,
                                          CONCAT48(fStack_2718,CONCAT44(fStack_2718,fStack_2718))));
            local_2510._0_4_ =
                 fStack_2718 * auVar115._0_4_ + fVar74 * auVar125._0_4_ + fVar63 * auVar82._0_4_;
            local_2510._4_4_ =
                 fStack_2718 * auVar115._4_4_ + fVar74 * auVar125._4_4_ + fVar63 * auVar82._4_4_;
            local_2510._8_4_ =
                 fStack_2718 * auVar115._8_4_ + fVar74 * auVar125._8_4_ + fVar63 * auVar82._8_4_;
            local_2510._12_4_ =
                 fStack_2718 * auVar115._12_4_ + fVar74 * auVar125._12_4_ + fVar63 * auVar82._12_4_;
            auVar115 = vsubps_avx(auVar81,auVar64);
            fVar79 = auVar81._0_4_ + auVar64._0_4_;
            fVar96 = auVar81._4_4_ + auVar64._4_4_;
            fVar98 = auVar81._8_4_ + auVar64._8_4_;
            fVar100 = auVar81._12_4_ + auVar64._12_4_;
            auVar81 = vsubps_avx(auVar123,auVar124);
            fVar139 = auVar123._0_4_ + auVar124._0_4_;
            fVar147 = auVar123._4_4_ + auVar124._4_4_;
            fVar114 = auVar123._8_4_ + auVar124._8_4_;
            fVar78 = auVar123._12_4_ + auVar124._12_4_;
            auVar123 = vsubps_avx(auVar91,auVar103);
            fVar76 = auVar91._0_4_ + auVar103._0_4_;
            fVar102 = auVar91._4_4_ + auVar103._4_4_;
            fVar111 = auVar91._8_4_ + auVar103._8_4_;
            fVar112 = auVar91._12_4_ + auVar103._12_4_;
            fVar122 = auVar123._0_4_;
            auVar117._0_4_ = fVar122 * fVar139;
            fVar130 = auVar123._4_4_;
            auVar117._4_4_ = fVar130 * fVar147;
            fVar131 = auVar123._8_4_;
            auVar117._8_4_ = fVar131 * fVar114;
            fVar132 = auVar123._12_4_;
            auVar117._12_4_ = fVar132 * fVar78;
            fVar161 = auVar81._0_4_;
            auVar134._0_4_ = fVar161 * fVar76;
            fVar164 = auVar81._4_4_;
            auVar134._4_4_ = fVar164 * fVar102;
            fVar165 = auVar81._8_4_;
            auVar134._8_4_ = fVar165 * fVar111;
            fVar166 = auVar81._12_4_;
            auVar134._12_4_ = fVar166 * fVar112;
            auVar81 = vsubps_avx(auVar134,auVar117);
            fVar75 = auVar115._0_4_;
            auVar53._0_4_ = fVar75 * fVar76;
            fVar76 = auVar115._4_4_;
            auVar53._4_4_ = fVar76 * fVar102;
            fVar102 = auVar115._8_4_;
            auVar53._8_4_ = fVar102 * fVar111;
            fVar111 = auVar115._12_4_;
            auVar53._12_4_ = fVar111 * fVar112;
            auVar135._0_4_ = fVar122 * fVar79;
            auVar135._4_4_ = fVar130 * fVar96;
            auVar135._8_4_ = fVar131 * fVar98;
            auVar135._12_4_ = fVar132 * fVar100;
            auVar123 = vsubps_avx(auVar135,auVar53);
            auVar84._0_4_ = fVar161 * fVar79;
            auVar84._4_4_ = fVar164 * fVar96;
            auVar84._8_4_ = fVar165 * fVar98;
            auVar84._12_4_ = fVar166 * fVar100;
            auVar66._0_4_ = fVar75 * fVar139;
            auVar66._4_4_ = fVar76 * fVar147;
            auVar66._8_4_ = fVar102 * fVar114;
            auVar66._12_4_ = fVar111 * fVar78;
            auVar91 = vsubps_avx(auVar66,auVar84);
            auVar54._0_4_ =
                 fStack_2718 * auVar81._0_4_ + fVar74 * auVar123._0_4_ + fVar63 * auVar91._0_4_;
            auVar54._4_4_ =
                 fStack_2718 * auVar81._4_4_ + fVar74 * auVar123._4_4_ + fVar63 * auVar91._4_4_;
            auVar54._8_4_ =
                 fStack_2718 * auVar81._8_4_ + fVar74 * auVar123._8_4_ + fVar63 * auVar91._8_4_;
            auVar54._12_4_ =
                 fStack_2718 * auVar81._12_4_ + fVar74 * auVar123._12_4_ + fVar63 * auVar91._12_4_;
            local_2600._0_4_ = auVar54._0_4_ + local_2500._0_4_ + local_2510._0_4_;
            local_2600._4_4_ = auVar54._4_4_ + local_2500._4_4_ + local_2510._4_4_;
            local_2600._8_4_ = auVar54._8_4_ + local_2500._8_4_ + local_2510._8_4_;
            local_2600._12_4_ = auVar54._12_4_ + local_2500._12_4_ + local_2510._12_4_;
            auVar81 = vminps_avx(local_2500,local_2510);
            auVar81 = vminps_avx(auVar81,auVar54);
            auVar85._8_4_ = 0x7fffffff;
            auVar85._0_8_ = 0x7fffffff7fffffff;
            auVar85._12_4_ = 0x7fffffff;
            local_2520 = vandps_avx(local_2600,auVar85);
            auVar86._0_4_ = local_2520._0_4_ * 1.1920929e-07;
            auVar86._4_4_ = local_2520._4_4_ * 1.1920929e-07;
            auVar86._8_4_ = local_2520._8_4_ * 1.1920929e-07;
            auVar86._12_4_ = local_2520._12_4_ * 1.1920929e-07;
            auVar95 = ZEXT1664(auVar86);
            uVar28 = CONCAT44(auVar86._4_4_,auVar86._0_4_);
            auVar118._0_8_ = uVar28 ^ 0x8000000080000000;
            auVar118._8_4_ = -auVar86._8_4_;
            auVar118._12_4_ = -auVar86._12_4_;
            auVar81 = vcmpps_avx(auVar81,auVar118,5);
            auVar123 = vmaxps_avx(local_2500,local_2510);
            auVar121 = ZEXT1664(auVar123);
            auVar123 = vmaxps_avx(auVar123,auVar54);
            auVar123 = vcmpps_avx(auVar123,auVar86,2);
            local_2530 = vorps_avx(auVar81,auVar123);
            auVar18._8_8_ = uStack_2628;
            auVar18._0_8_ = local_2630;
            auVar18 = auVar18 & local_2530;
            if ((((auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar18 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar18[0xf] < '\0') {
              auVar55._0_4_ = fVar41 * fVar113;
              auVar55._4_4_ = fVar49 * fVar146;
              auVar55._8_4_ = fVar48 * fVar148;
              auVar55._12_4_ = fVar50 * fVar77;
              auVar67._0_4_ = fVar180 * fVar167;
              auVar67._4_4_ = fVar182 * fVar170;
              auVar67._8_4_ = fVar183 * fVar171;
              auVar67._12_4_ = fVar184 * fVar172;
              auVar91 = vsubps_avx(auVar67,auVar55);
              auVar87._0_4_ = fVar167 * fVar161;
              auVar87._4_4_ = fVar170 * fVar164;
              auVar87._8_4_ = fVar171 * fVar165;
              auVar87._12_4_ = fVar172 * fVar166;
              auVar119._0_4_ = fVar113 * fVar122;
              auVar119._4_4_ = fVar146 * fVar130;
              auVar119._8_4_ = fVar148 * fVar131;
              auVar119._12_4_ = fVar77 * fVar132;
              auVar64 = vsubps_avx(auVar119,auVar87);
              auVar136._8_4_ = 0x7fffffff;
              auVar136._0_8_ = 0x7fffffff7fffffff;
              auVar136._12_4_ = 0x7fffffff;
              auVar81 = vandps_avx(auVar55,auVar136);
              auVar123 = vandps_avx(auVar87,auVar136);
              auVar81 = vcmpps_avx(auVar81,auVar123,1);
              local_25a0 = vblendvps_avx(auVar64,auVar91,auVar81);
              auVar121 = ZEXT1664(local_25a0);
              auVar56._0_4_ = fVar155 * fVar122;
              auVar56._4_4_ = fVar158 * fVar130;
              auVar56._8_4_ = fVar159 * fVar131;
              auVar56._12_4_ = fVar160 * fVar132;
              auVar68._0_4_ = fVar41 * fVar155;
              auVar68._4_4_ = fVar49 * fVar158;
              auVar68._8_4_ = fVar48 * fVar159;
              auVar68._12_4_ = fVar50 * fVar160;
              auVar88._0_4_ = fVar173 * fVar167;
              auVar88._4_4_ = fVar177 * fVar170;
              auVar88._8_4_ = fVar178 * fVar171;
              auVar88._12_4_ = fVar179 * fVar172;
              auVar91 = vsubps_avx(auVar68,auVar88);
              auVar126._0_4_ = fVar167 * fVar75;
              auVar126._4_4_ = fVar170 * fVar76;
              auVar126._8_4_ = fVar171 * fVar102;
              auVar126._12_4_ = fVar172 * fVar111;
              auVar64 = vsubps_avx(auVar126,auVar56);
              auVar81 = vandps_avx(auVar88,auVar136);
              auVar123 = vandps_avx(auVar56,auVar136);
              auVar81 = vcmpps_avx(auVar81,auVar123,1);
              local_2590 = vblendvps_avx(auVar64,auVar91,auVar81);
              auVar45._0_4_ = fVar113 * fVar75;
              auVar45._4_4_ = fVar146 * fVar76;
              auVar45._8_4_ = fVar148 * fVar102;
              auVar45._12_4_ = fVar77 * fVar111;
              auVar69._0_4_ = fVar173 * fVar113;
              auVar69._4_4_ = fVar177 * fVar146;
              auVar69._8_4_ = fVar178 * fVar148;
              auVar69._12_4_ = fVar179 * fVar77;
              auVar89._0_4_ = fVar180 * fVar155;
              auVar89._4_4_ = fVar182 * fVar158;
              auVar89._8_4_ = fVar183 * fVar159;
              auVar89._12_4_ = fVar184 * fVar160;
              auVar127._0_4_ = fVar155 * fVar161;
              auVar127._4_4_ = fVar158 * fVar164;
              auVar127._8_4_ = fVar159 * fVar165;
              auVar127._12_4_ = fVar160 * fVar166;
              auVar91 = vsubps_avx(auVar69,auVar89);
              auVar64 = vsubps_avx(auVar127,auVar45);
              auVar81 = vandps_avx(auVar89,auVar136);
              auVar123 = vandps_avx(auVar45,auVar136);
              auVar81 = vcmpps_avx(auVar81,auVar123,1);
              local_2580[0] = vblendvps_avx(auVar64,auVar91,auVar81);
              fVar41 = fStack_2718 * local_25a0._0_4_ +
                       local_2590._0_4_ * fVar74 + local_2580[0]._0_4_ * fVar63;
              fVar75 = fStack_2718 * local_25a0._4_4_ +
                       local_2590._4_4_ * fVar74 + local_2580[0]._4_4_ * fVar63;
              fVar49 = fStack_2718 * local_25a0._8_4_ +
                       local_2590._8_4_ * fVar74 + local_2580[0]._8_4_ * fVar63;
              fVar63 = fStack_2718 * local_25a0._12_4_ +
                       local_2590._12_4_ * fVar74 + local_2580[0]._12_4_ * fVar63;
              auVar46._0_4_ = fVar41 + fVar41;
              auVar46._4_4_ = fVar75 + fVar75;
              auVar46._8_4_ = fVar49 + fVar49;
              auVar46._12_4_ = fVar63 + fVar63;
              fVar80 = local_25a0._0_4_ * fVar80 +
                       local_2590._0_4_ * fVar8 + local_2580[0]._0_4_ * fVar9;
              fVar97 = local_25a0._4_4_ * fVar101 +
                       local_2590._4_4_ * fVar97 + local_2580[0]._4_4_ * fVar99;
              fVar99 = local_25a0._8_4_ * fVar12 +
                       local_2590._8_4_ * fVar10 + local_2580[0]._8_4_ * fVar11;
              fVar101 = local_25a0._12_4_ * fVar15 +
                        local_2590._12_4_ * fVar13 + local_2580[0]._12_4_ * fVar14;
              auVar81 = vrcpps_avx(auVar46);
              fVar63 = auVar81._0_4_;
              auVar137._0_4_ = auVar46._0_4_ * fVar63;
              fVar74 = auVar81._4_4_;
              auVar137._4_4_ = auVar46._4_4_ * fVar74;
              fVar8 = auVar81._8_4_;
              auVar137._8_4_ = auVar46._8_4_ * fVar8;
              fVar9 = auVar81._12_4_;
              auVar137._12_4_ = auVar46._12_4_ * fVar9;
              auVar144._8_4_ = 0x3f800000;
              auVar144._0_8_ = 0x3f8000003f800000;
              auVar144._12_4_ = 0x3f800000;
              auVar81 = vsubps_avx(auVar144,auVar137);
              local_2730._0_4_ = (fVar80 + fVar80) * (fVar63 + fVar63 * auVar81._0_4_);
              local_2730._4_4_ = (fVar97 + fVar97) * (fVar74 + fVar74 * auVar81._4_4_);
              local_2730._8_4_ = (fVar99 + fVar99) * (fVar8 + fVar8 * auVar81._8_4_);
              local_2730._12_4_ = (fVar101 + fVar101) * (fVar9 + fVar9 * auVar81._12_4_);
              uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar90._4_4_ = uVar25;
              auVar90._0_4_ = uVar25;
              auVar90._8_4_ = uVar25;
              auVar90._12_4_ = uVar25;
              auVar81 = vcmpps_avx(auVar90,local_2730,2);
              fVar63 = (ray->super_RayK<1>).tfar;
              auVar128._4_4_ = fVar63;
              auVar128._0_4_ = fVar63;
              auVar128._8_4_ = fVar63;
              auVar128._12_4_ = fVar63;
              auVar123 = vcmpps_avx(local_2730,auVar128,2);
              auVar81 = vandps_avx(auVar81,auVar123);
              auVar123 = vcmpps_avx(auVar46,_DAT_01f7aa10,4);
              auVar81 = vandps_avx(auVar123,auVar81);
              auVar24._8_8_ = uStack_2628;
              auVar24._0_8_ = local_2630;
              auVar123 = vandps_avx(local_2530,auVar24);
              auVar81 = vpslld_avx(auVar81,0x1f);
              auVar91 = vpsrad_avx(auVar81,0x1f);
              auVar95 = ZEXT1664(auVar91);
              auVar81 = auVar123 & auVar91;
              if ((((auVar81 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar81 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar81[0xf] < '\0') {
                local_26f0._0_4_ = (ray->super_RayK<1>).tfar;
                local_26f0._4_4_ = (ray->super_RayK<1>).mask;
                local_26f0._8_4_ = (ray->super_RayK<1>).id;
                local_26f0._12_4_ = (ray->super_RayK<1>).flags;
                auVar123 = vandps_avx(auVar91,auVar123);
                auVar110 = ZEXT1664(local_2510);
                local_2620._16_16_ = local_2510;
                local_2620._0_16_ = local_2500;
                local_25f0 = &local_2749;
                local_25e0 = auVar123;
                local_25b0 = local_2730;
                pSVar35 = local_26b8->scene;
                local_26d0 = auVar123;
                auVar81 = vrcpps_avx(local_2600);
                fVar63 = auVar81._0_4_;
                auVar70._0_4_ = local_2600._0_4_ * fVar63;
                fVar74 = auVar81._4_4_;
                auVar70._4_4_ = local_2600._4_4_ * fVar74;
                fVar8 = auVar81._8_4_;
                auVar70._8_4_ = local_2600._8_4_ * fVar8;
                fVar9 = auVar81._12_4_;
                auVar70._12_4_ = local_2600._12_4_ * fVar9;
                auVar92._8_4_ = 0x3f800000;
                auVar92._0_8_ = 0x3f8000003f800000;
                auVar92._12_4_ = 0x3f800000;
                auVar81 = vsubps_avx(auVar92,auVar70);
                auVar57._0_4_ = fVar63 + fVar63 * auVar81._0_4_;
                auVar57._4_4_ = fVar74 + fVar74 * auVar81._4_4_;
                auVar57._8_4_ = fVar8 + fVar8 * auVar81._8_4_;
                auVar57._12_4_ = fVar9 + fVar9 * auVar81._12_4_;
                auVar71._8_4_ = 0x219392ef;
                auVar71._0_8_ = 0x219392ef219392ef;
                auVar71._12_4_ = 0x219392ef;
                auVar121 = ZEXT1664(local_2520);
                auVar81 = vcmpps_avx(local_2520,auVar71,5);
                auVar81 = vandps_avx(auVar81,auVar57);
                auVar72._0_4_ = local_2500._0_4_ * auVar81._0_4_;
                auVar72._4_4_ = local_2500._4_4_ * auVar81._4_4_;
                auVar72._8_4_ = local_2500._8_4_ * auVar81._8_4_;
                auVar72._12_4_ = local_2500._12_4_ * auVar81._12_4_;
                local_25d0 = vminps_avx(auVar72,auVar92);
                auVar58._0_4_ = local_2510._0_4_ * auVar81._0_4_;
                auVar58._4_4_ = local_2510._4_4_ * auVar81._4_4_;
                auVar58._8_4_ = local_2510._8_4_ * auVar81._8_4_;
                auVar58._12_4_ = local_2510._12_4_ * auVar81._12_4_;
                local_25c0 = vminps_avx(auVar58,auVar92);
                auVar59._8_4_ = 0x7f800000;
                auVar59._0_8_ = 0x7f8000007f800000;
                auVar59._12_4_ = 0x7f800000;
                auVar81 = vblendvps_avx(auVar59,local_2730,auVar123);
                auVar91 = vshufps_avx(auVar81,auVar81,0xb1);
                auVar91 = vminps_avx(auVar91,auVar81);
                auVar64 = vshufpd_avx(auVar91,auVar91,1);
                auVar95 = ZEXT1664(auVar64);
                auVar91 = vminps_avx(auVar64,auVar91);
                auVar81 = vcmpps_avx(auVar81,auVar91,0);
                auVar91 = auVar123 & auVar81;
                if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar91 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar91 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar91[0xf] < '\0') {
                  auVar123 = vandps_avx(auVar81,auVar123);
                }
                lVar37 = lVar37 + uVar40;
                uVar36 = vextractps_avx(local_26f0,1);
                uVar25 = vmovmskps_avx(auVar123);
                uVar28 = CONCAT44((int)((ulong)local_26b8 >> 0x20),uVar25);
                piVar27 = (int *)0x0;
                fStack_2714 = fStack_2718;
                if (uVar28 != 0) {
                  for (; (uVar28 >> (long)piVar27 & 1) == 0; piVar27 = (int *)((long)piVar27 + 1)) {
                  }
                }
                do {
                  uVar5 = *(uint *)(lVar37 + 0x120 + (long)piVar27 * 4);
                  pGVar7 = (pSVar35->geometries).items[uVar5].ptr;
                  if ((pGVar7->mask & uVar36) == 0) {
                    *(undefined4 *)(local_26d0 + (long)piVar27 * 4) = 0;
                  }
                  else {
                    local_2740._0_8_ = piVar27;
                    local_26b0._0_8_ = local_26b8->args;
                    uStack_271c = (undefined4)((ulong)pSVar35 >> 0x20);
                    if (local_26b8->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar31 = local_26b8->user;
                      if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar63 = *(float *)(local_25d0 + (long)piVar27 * 4);
                        fVar74 = *(float *)(local_25c0 + (long)piVar27 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_25b0 + (long)piVar27 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_25a0 + (long)piVar27 * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_2590 + (long)piVar27 * 4);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_2580[0] + (long)piVar27 * 4);
                        ray->u = fVar63;
                        ray->v = fVar74;
                        ray->primID = *(uint *)(lVar37 + 0x130 + (long)piVar27 * 4);
                        ray->geomID = uVar5;
                        ray->instID[0] = pRVar31->instID[0];
                        ray->instPrimID[0] = pRVar31->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar31 = local_26b8->user;
                    }
                    local_2720 = SUB84(pSVar35,0);
                    local_2654 = *(uint *)(local_25d0 + (long)piVar27 * 4);
                    auVar121 = ZEXT464(local_2654);
                    local_265c = *(uint *)(local_2590 + (long)piVar27 * 4);
                    auVar95 = ZEXT464(local_265c);
                    local_2658 = *(uint *)(local_2580[0] + (long)piVar27 * 4);
                    auVar110 = ZEXT464(local_2658);
                    local_2660 = *(undefined4 *)(local_25a0 + (long)piVar27 * 4);
                    local_2650 = *(undefined4 *)(local_25c0 + (long)piVar27 * 4);
                    local_264c = *(undefined4 *)(lVar37 + 0x130 + (long)piVar27 * 4);
                    local_2648 = uVar5;
                    local_2644 = pRVar31->instID[0];
                    local_2640 = pRVar31->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_25b0 + (long)piVar27 * 4);
                    local_2704 = -1;
                    local_26a0.valid = &local_2704;
                    local_26a0.geometryUserPtr = pGVar7->userPtr;
                    local_26a0.context = pRVar31;
                    local_26a0.ray = (RTCRayN *)ray;
                    local_26a0.hit = (RTCHitN *)&local_2660;
                    local_26a0.N = 1;
                    local_2700._0_8_ = pGVar7;
                    local_26e0._0_8_ = lVar37;
                    if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_014d173b:
                      if ((*(code **)(local_26b0._0_8_ + 0x10) != (code *)0x0) &&
                         (((*(byte *)local_26b0._0_8_ & 2) != 0 ||
                          ((*(byte *)(local_2700._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar95 = ZEXT1664(auVar95._0_16_);
                        auVar110 = ZEXT1664(auVar110._0_16_);
                        auVar121 = ZEXT1664(auVar121._0_16_);
                        (**(code **)(local_26b0._0_8_ + 0x10))(&local_26a0);
                        uVar29 = local_2748;
                        if (*local_26a0.valid == 0) goto LAB_014d17f5;
                      }
                      (((Vec3f *)((long)local_26a0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_26a0.hit;
                      (((Vec3f *)((long)local_26a0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_26a0.hit + 4);
                      (((Vec3f *)((long)local_26a0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_26a0.hit + 8);
                      *(float *)((long)local_26a0.ray + 0x3c) = *(float *)(local_26a0.hit + 0xc);
                      *(float *)((long)local_26a0.ray + 0x40) = *(float *)(local_26a0.hit + 0x10);
                      *(float *)((long)local_26a0.ray + 0x44) = *(float *)(local_26a0.hit + 0x14);
                      *(float *)((long)local_26a0.ray + 0x48) = *(float *)(local_26a0.hit + 0x18);
                      *(float *)((long)local_26a0.ray + 0x4c) = *(float *)(local_26a0.hit + 0x1c);
                      *(float *)((long)local_26a0.ray + 0x50) = *(float *)(local_26a0.hit + 0x20);
                    }
                    else {
                      auVar95 = ZEXT464(local_265c);
                      auVar110 = ZEXT464(local_2658);
                      auVar121 = ZEXT464(local_2654);
                      (*pGVar7->intersectionFilterN)(&local_26a0);
                      uVar29 = local_2748;
                      if (*local_26a0.valid != 0) goto LAB_014d173b;
LAB_014d17f5:
                      (ray->super_RayK<1>).tfar = (float)local_26f0._0_4_;
                      uVar29 = local_2748;
                    }
                    pSVar35 = (Scene *)CONCAT44(uStack_271c,local_2720);
                    *(undefined4 *)(local_26d0 + local_2740._0_8_ * 4) = 0;
                    fVar63 = (ray->super_RayK<1>).tfar;
                    auVar60._4_4_ = fVar63;
                    auVar60._0_4_ = fVar63;
                    auVar60._8_4_ = fVar63;
                    auVar60._12_4_ = fVar63;
                    auVar81 = vcmpps_avx(local_2730,auVar60,2);
                    local_26d0 = vandps_avx(auVar81,local_26d0);
                    local_26f0._0_4_ = (ray->super_RayK<1>).tfar;
                    local_26f0._4_4_ = (ray->super_RayK<1>).mask;
                    local_26f0._8_4_ = (ray->super_RayK<1>).id;
                    local_26f0._12_4_ = (ray->super_RayK<1>).flags;
                    uVar36 = vextractps_avx(local_26f0,1);
                    lVar37 = local_26e0._0_8_;
                  }
                  if ((((local_26d0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_26d0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_26d0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_26d0[0xf]) break;
                  local_26e0._0_8_ = lVar37;
                  local_2720 = SUB84(pSVar35,0);
                  uStack_271c = (undefined4)((ulong)pSVar35 >> 0x20);
                  local_2740._0_4_ = uVar36;
                  auVar95 = ZEXT1664(auVar95._0_16_);
                  auVar110 = ZEXT1664(auVar110._0_16_);
                  auVar121 = ZEXT1664(auVar121._0_16_);
                  BVHNIntersector1<8,16777232,true,embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Pluecker<4,true>>>
                  ::intersect(&local_26a0);
                  pSVar35 = (Scene *)CONCAT44(uStack_271c,local_2720);
                  piVar27 = local_26a0.valid;
                  lVar37 = local_26e0._0_8_;
                  uVar29 = local_2748;
                  uVar36 = local_2740._0_4_;
                } while( true );
              }
            }
            local_2710 = local_2710 + 1;
          } while (local_2710 != local_2670);
        }
        fVar63 = (ray->super_RayK<1>).tfar;
        auVar47 = ZEXT3264(CONCAT428(fVar63,CONCAT424(fVar63,CONCAT420(fVar63,CONCAT416(fVar63,
                                                  CONCAT412(fVar63,CONCAT48(fVar63,CONCAT44(fVar63,
                                                  fVar63))))))));
        auVar62 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar145 = ZEXT3264(local_23c0);
        auVar152 = ZEXT3264(local_23e0);
        auVar154 = ZEXT3264(local_2400);
        auVar157 = ZEXT3264(local_2420);
        auVar163 = ZEXT3264(local_2440);
        auVar169 = ZEXT3264(local_2460);
        auVar129 = ZEXT3264(local_2480);
        auVar138 = ZEXT3264(local_24a0);
        auVar176 = ZEXT3264(local_24c0);
        auVar181 = ZEXT3264(local_2560);
      }
    } while (pauVar26 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }